

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void aom_comp_mask_pred_ssse3
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 (*pauVar24) [16];
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  char cVar94;
  char cVar95;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  char cVar107;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar86 [16];
  undefined1 auVar108 [16];
  undefined1 auVar116 [16];
  undefined1 auVar124 [16];
  undefined1 auVar132 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar70 [16];
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar62 [16];
  undefined1 auVar71 [16];
  undefined1 auVar80 [16];
  undefined1 auVar88 [16];
  undefined1 auVar63 [16];
  undefined1 auVar72 [16];
  undefined1 auVar81 [16];
  undefined1 auVar89 [16];
  undefined1 auVar64 [16];
  undefined1 auVar73 [16];
  undefined1 auVar82 [16];
  undefined1 auVar90 [16];
  undefined1 auVar65 [16];
  undefined1 auVar74 [16];
  undefined1 auVar83 [16];
  undefined1 auVar91 [16];
  undefined1 auVar66 [16];
  undefined1 auVar75 [16];
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar67 [16];
  undefined1 auVar76 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [16];
  undefined1 auVar109 [16];
  undefined1 auVar117 [16];
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar110 [16];
  undefined1 auVar118 [16];
  undefined1 auVar126 [16];
  undefined1 auVar134 [16];
  undefined1 auVar111 [16];
  undefined1 auVar119 [16];
  undefined1 auVar127 [16];
  undefined1 auVar135 [16];
  undefined1 auVar112 [16];
  undefined1 auVar120 [16];
  undefined1 auVar128 [16];
  undefined1 auVar136 [16];
  undefined1 auVar113 [16];
  undefined1 auVar121 [16];
  undefined1 auVar129 [16];
  undefined1 auVar137 [16];
  undefined1 auVar114 [16];
  undefined1 auVar122 [16];
  undefined1 auVar130 [16];
  undefined1 auVar138 [16];
  undefined1 auVar115 [16];
  undefined1 auVar123 [16];
  undefined1 auVar131 [16];
  undefined1 auVar139 [16];
  
  auVar23 = _DAT_00514960;
  iVar26 = ref_stride;
  iVar22 = width;
  pauVar24 = (undefined1 (*) [16])pred;
  if (invert_mask == 0) {
    iVar26 = width;
    iVar22 = ref_stride;
    pauVar24 = (undefined1 (*) [16])ref;
    ref = pred;
  }
  if (width == 8) {
    lVar28 = 0;
    do {
      uVar2 = *(ulong *)*pauVar24;
      uVar3 = *(undefined8 *)*(undefined1 (*) [16])ref;
      auVar37._8_6_ = 0;
      auVar37._0_8_ = uVar2;
      auVar37[0xe] = (char)(uVar2 >> 0x38);
      auVar37[0xf] = (char)((ulong)uVar3 >> 0x38);
      auVar51._14_2_ = auVar37._14_2_;
      auVar51._8_5_ = 0;
      auVar51._0_8_ = uVar2;
      auVar51[0xd] = (char)((ulong)uVar3 >> 0x30);
      auVar68._13_3_ = auVar51._13_3_;
      auVar68._8_4_ = 0;
      auVar68._0_8_ = uVar2;
      auVar68[0xc] = (char)(uVar2 >> 0x30);
      auVar39._12_4_ = auVar68._12_4_;
      auVar39._8_3_ = 0;
      auVar39._0_8_ = uVar2;
      auVar39[0xb] = (char)((ulong)uVar3 >> 0x28);
      auVar34._11_5_ = auVar39._11_5_;
      auVar34._8_2_ = 0;
      auVar34._0_8_ = uVar2;
      auVar34[10] = (char)(uVar2 >> 0x28);
      auVar33._10_6_ = auVar34._10_6_;
      auVar33[8] = 0;
      auVar33._0_8_ = uVar2;
      auVar33[9] = (char)((ulong)uVar3 >> 0x20);
      auVar32._9_7_ = auVar33._9_7_;
      auVar32[8] = (char)(uVar2 >> 0x20);
      auVar32._0_8_ = uVar2;
      auVar31._8_8_ = auVar32._8_8_;
      auVar31[7] = (char)((ulong)uVar3 >> 0x18);
      auVar31[6] = (char)(uVar2 >> 0x18);
      auVar31[5] = (char)((ulong)uVar3 >> 0x10);
      auVar31[4] = (char)(uVar2 >> 0x10);
      auVar31[3] = (char)((ulong)uVar3 >> 8);
      auVar31[2] = (char)(uVar2 >> 8);
      auVar31[0] = (undefined1)uVar2;
      auVar31[1] = (char)uVar3;
      uVar2 = *(ulong *)mask;
      uVar4 = *(ulong *)(*pauVar24 + iVar22);
      uVar3 = *(undefined8 *)(*(undefined1 (*) [16])ref + iVar26);
      uVar5 = *(undefined8 *)((long)mask + (long)mask_stride);
      auVar59._8_6_ = 0;
      auVar59._0_8_ = uVar4;
      auVar59[0xe] = (char)(uVar4 >> 0x38);
      auVar59[0xf] = (char)((ulong)uVar3 >> 0x38);
      auVar58._14_2_ = auVar59._14_2_;
      auVar58._8_5_ = 0;
      auVar58._0_8_ = uVar4;
      auVar58[0xd] = (char)((ulong)uVar3 >> 0x30);
      auVar57._13_3_ = auVar58._13_3_;
      auVar57._8_4_ = 0;
      auVar57._0_8_ = uVar4;
      auVar57[0xc] = (char)(uVar4 >> 0x30);
      auVar56._12_4_ = auVar57._12_4_;
      auVar56._8_3_ = 0;
      auVar56._0_8_ = uVar4;
      auVar56[0xb] = (char)((ulong)uVar3 >> 0x28);
      auVar55._11_5_ = auVar56._11_5_;
      auVar55._8_2_ = 0;
      auVar55._0_8_ = uVar4;
      auVar55[10] = (char)(uVar4 >> 0x28);
      auVar54._10_6_ = auVar55._10_6_;
      auVar54[8] = 0;
      auVar54._0_8_ = uVar4;
      auVar54[9] = (char)((ulong)uVar3 >> 0x20);
      auVar53._9_7_ = auVar54._9_7_;
      auVar53[8] = (char)(uVar4 >> 0x20);
      auVar53._0_8_ = uVar4;
      auVar52._8_8_ = auVar53._8_8_;
      auVar52[7] = (char)((ulong)uVar3 >> 0x18);
      auVar52[6] = (char)(uVar4 >> 0x18);
      auVar52[5] = (char)((ulong)uVar3 >> 0x10);
      auVar52[4] = (char)(uVar4 >> 0x10);
      auVar52[3] = (char)((ulong)uVar3 >> 8);
      auVar52[2] = (char)(uVar4 >> 8);
      auVar52[0] = (undefined1)uVar4;
      auVar52[1] = (char)uVar3;
      cVar94 = (char)(uVar2 >> 8);
      cVar95 = (char)(uVar2 >> 0x10);
      cVar96 = (char)(uVar2 >> 0x18);
      cVar97 = (char)(uVar2 >> 0x20);
      cVar98 = (char)(uVar2 >> 0x28);
      cVar99 = (char)(uVar2 >> 0x30);
      cVar100 = (char)(uVar2 >> 0x38);
      cVar101 = (char)((ulong)uVar5 >> 8);
      cVar102 = (char)((ulong)uVar5 >> 0x10);
      cVar103 = (char)((ulong)uVar5 >> 0x18);
      cVar104 = (char)((ulong)uVar5 >> 0x20);
      cVar105 = (char)((ulong)uVar5 >> 0x28);
      cVar106 = (char)((ulong)uVar5 >> 0x30);
      cVar107 = (char)((ulong)uVar5 >> 0x38);
      auVar48._8_6_ = 0;
      auVar48._0_8_ = uVar2;
      auVar48[0xe] = cVar100;
      auVar48[0xf] = '@' - cVar100;
      auVar47._14_2_ = auVar48._14_2_;
      auVar47._8_5_ = 0;
      auVar47._0_8_ = uVar2;
      auVar47[0xd] = '@' - cVar99;
      auVar46._13_3_ = auVar47._13_3_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar2;
      auVar46[0xc] = cVar99;
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._8_3_ = 0;
      auVar45._0_8_ = uVar2;
      auVar45[0xb] = '@' - cVar98;
      auVar44._11_5_ = auVar45._11_5_;
      auVar44._8_2_ = 0;
      auVar44._0_8_ = uVar2;
      auVar44[10] = cVar98;
      auVar43._10_6_ = auVar44._10_6_;
      auVar43[8] = 0;
      auVar43._0_8_ = uVar2;
      auVar43[9] = '@' - cVar97;
      auVar42._9_7_ = auVar43._9_7_;
      auVar42[8] = cVar97;
      auVar42._0_8_ = uVar2;
      auVar41._8_8_ = auVar42._8_8_;
      auVar41[7] = '@' - cVar96;
      auVar41[6] = cVar96;
      auVar41[5] = '@' - cVar95;
      auVar41[4] = cVar95;
      auVar41[3] = '@' - cVar94;
      auVar41[2] = cVar94;
      auVar41[1] = '@' - (char)uVar2;
      auVar41[0] = (char)uVar2;
      auVar39 = pmaddubsw(auVar31,auVar41);
      auVar77[1] = '@' - (char)uVar5;
      auVar77[0] = (char)uVar5;
      auVar77[2] = cVar101;
      auVar77[3] = '@' - cVar101;
      auVar77[4] = cVar102;
      auVar77[5] = '@' - cVar102;
      auVar77[6] = cVar103;
      auVar77[7] = '@' - cVar103;
      auVar77[8] = cVar104;
      auVar77[9] = '@' - cVar104;
      auVar77[10] = cVar105;
      auVar77[0xb] = '@' - cVar105;
      auVar77[0xc] = cVar106;
      auVar77[0xd] = '@' - cVar106;
      auVar77[0xe] = cVar107;
      auVar77[0xf] = '@' - cVar107;
      auVar37 = pmaddubsw(auVar52,auVar77);
      auVar39 = pmulhrsw(auVar39,auVar23);
      auVar37 = pmulhrsw(auVar37,auVar23);
      sVar6 = auVar39._0_2_;
      sVar7 = auVar39._2_2_;
      sVar8 = auVar39._4_2_;
      sVar9 = auVar39._6_2_;
      sVar10 = auVar39._8_2_;
      sVar11 = auVar39._10_2_;
      sVar12 = auVar39._12_2_;
      sVar13 = auVar39._14_2_;
      sVar14 = auVar37._0_2_;
      sVar15 = auVar37._2_2_;
      sVar16 = auVar37._4_2_;
      sVar17 = auVar37._6_2_;
      sVar18 = auVar37._8_2_;
      sVar19 = auVar37._10_2_;
      sVar20 = auVar37._12_2_;
      sVar21 = auVar37._14_2_;
      puVar1 = comp_pred + lVar28 * 8;
      *puVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar39[0] - (0xff < sVar6);
      puVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar39[2] - (0xff < sVar7);
      puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar39[4] - (0xff < sVar8);
      puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar39[6] - (0xff < sVar9);
      puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar39[8] - (0xff < sVar10);
      puVar1[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar39[10] - (0xff < sVar11);
      puVar1[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar39[0xc] - (0xff < sVar12);
      puVar1[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar39[0xe] - (0xff < sVar13);
      puVar1[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar37[0] - (0xff < sVar14);
      puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar37[2] - (0xff < sVar15);
      puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar37[4] - (0xff < sVar16);
      puVar1[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar37[6] - (0xff < sVar17);
      puVar1[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar37[8] - (0xff < sVar18);
      puVar1[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar37[10] - (0xff < sVar19);
      puVar1[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar37[0xc] - (0xff < sVar20);
      puVar1[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar37[0xe] - (0xff < sVar21);
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + iVar22 * 2);
      ref = *(undefined1 (*) [16])ref + iVar26 * 2;
      mask = (uint8_t *)((long)mask + (long)(mask_stride * 2));
      lVar28 = lVar28 + 2;
    } while ((int)lVar28 < height);
  }
  else if (width == 0x10) {
    iVar25 = 0;
    do {
      auVar39 = *(undefined1 (*) [16])mask;
      auVar37 = lddqu(in_XMM3,*pauVar24);
      auVar51 = lddqu(in_XMM4,*(undefined1 (*) [16])ref);
      auVar67._0_14_ = auVar37._0_14_;
      auVar67[0xe] = auVar37[7];
      auVar67[0xf] = auVar51[7];
      auVar66._14_2_ = auVar67._14_2_;
      auVar66._0_13_ = auVar37._0_13_;
      auVar66[0xd] = auVar51[6];
      auVar65._13_3_ = auVar66._13_3_;
      auVar65._0_12_ = auVar37._0_12_;
      auVar65[0xc] = auVar37[6];
      auVar64._12_4_ = auVar65._12_4_;
      auVar64._0_11_ = auVar37._0_11_;
      auVar64[0xb] = auVar51[5];
      auVar63._11_5_ = auVar64._11_5_;
      auVar63._0_10_ = auVar37._0_10_;
      auVar63[10] = auVar37[5];
      auVar62._10_6_ = auVar63._10_6_;
      auVar62._0_9_ = auVar37._0_9_;
      auVar62[9] = auVar51[4];
      auVar61._9_7_ = auVar62._9_7_;
      auVar61._0_8_ = auVar37._0_8_;
      auVar61[8] = auVar37[4];
      auVar60._8_8_ = auVar61._8_8_;
      auVar60[7] = auVar51[3];
      auVar60[6] = auVar37[3];
      auVar60[5] = auVar51[2];
      auVar60[4] = auVar37[2];
      auVar60[3] = auVar51[1];
      auVar60[2] = auVar37[1];
      auVar60[0] = auVar37[0];
      auVar60[1] = auVar51[0];
      auVar115._0_14_ = auVar39._0_14_;
      auVar115[0xe] = auVar39[7];
      auVar115[0xf] = '@' - auVar39[7];
      auVar114._14_2_ = auVar115._14_2_;
      auVar114._0_13_ = auVar39._0_13_;
      auVar114[0xd] = '@' - auVar39[6];
      auVar113._13_3_ = auVar114._13_3_;
      auVar113._0_12_ = auVar39._0_12_;
      auVar113[0xc] = auVar39[6];
      auVar112._12_4_ = auVar113._12_4_;
      auVar112._0_11_ = auVar39._0_11_;
      auVar112[0xb] = '@' - auVar39[5];
      auVar111._11_5_ = auVar112._11_5_;
      auVar111._0_10_ = auVar39._0_10_;
      auVar111[10] = auVar39[5];
      auVar110._10_6_ = auVar111._10_6_;
      auVar110._0_9_ = auVar39._0_9_;
      auVar110[9] = '@' - auVar39[4];
      auVar109._9_7_ = auVar110._9_7_;
      auVar109._0_8_ = auVar39._0_8_;
      auVar109[8] = auVar39[4];
      auVar108._8_8_ = auVar109._8_8_;
      auVar108[7] = '@' - auVar39[3];
      auVar108[6] = auVar39[3];
      auVar108[5] = '@' - auVar39[2];
      auVar108[4] = auVar39[2];
      auVar108[3] = '@' - auVar39[1];
      auVar108[2] = auVar39[1];
      auVar108[1] = '@' - auVar39[0];
      auVar108[0] = auVar39[0];
      auVar68 = pmaddubsw(auVar60,auVar108);
      auVar38[1] = auVar51[8];
      auVar38[0] = auVar37[8];
      auVar38[2] = auVar37[9];
      auVar38[3] = auVar51[9];
      auVar38[4] = auVar37[10];
      auVar38[5] = auVar51[10];
      auVar38[6] = auVar37[0xb];
      auVar38[7] = auVar51[0xb];
      auVar38[8] = auVar37[0xc];
      auVar38[9] = auVar51[0xc];
      auVar38[10] = auVar37[0xd];
      auVar38[0xb] = auVar51[0xd];
      auVar38[0xc] = auVar37[0xe];
      auVar38[0xd] = auVar51[0xe];
      auVar38[0xe] = auVar37[0xf];
      auVar38[0xf] = auVar51[0xf];
      auVar29[1] = '@' - auVar39[8];
      auVar29[0] = auVar39[8];
      auVar29[2] = auVar39[9];
      auVar29[3] = '@' - auVar39[9];
      auVar29[4] = auVar39[10];
      auVar29[5] = '@' - auVar39[10];
      auVar29[6] = auVar39[0xb];
      auVar29[7] = '@' - auVar39[0xb];
      auVar29[8] = auVar39[0xc];
      auVar29[9] = '@' - auVar39[0xc];
      auVar29[10] = auVar39[0xd];
      auVar29[0xb] = '@' - auVar39[0xd];
      auVar29[0xc] = auVar39[0xe];
      auVar29[0xd] = '@' - auVar39[0xe];
      auVar29[0xe] = auVar39[0xf];
      auVar29[0xf] = '@' - auVar39[0xf];
      auVar39 = pmaddubsw(auVar38,auVar29);
      auVar68 = pmulhrsw(auVar68,auVar23);
      auVar37 = pmulhrsw(auVar39,auVar23);
      sVar6 = auVar68._0_2_;
      sVar7 = auVar68._2_2_;
      sVar8 = auVar68._4_2_;
      sVar9 = auVar68._6_2_;
      sVar10 = auVar68._8_2_;
      sVar11 = auVar68._10_2_;
      sVar12 = auVar68._12_2_;
      sVar13 = auVar68._14_2_;
      sVar14 = auVar37._0_2_;
      sVar15 = auVar37._2_2_;
      sVar16 = auVar37._4_2_;
      sVar17 = auVar37._6_2_;
      sVar18 = auVar37._8_2_;
      sVar19 = auVar37._10_2_;
      sVar20 = auVar37._12_2_;
      sVar21 = auVar37._14_2_;
      *comp_pred = (0 < sVar6) * (sVar6 < 0x100) * auVar68[0] - (0xff < sVar6);
      comp_pred[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar68[2] - (0xff < sVar7);
      comp_pred[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar68[4] - (0xff < sVar8);
      comp_pred[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar68[6] - (0xff < sVar9);
      comp_pred[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar68[8] - (0xff < sVar10);
      comp_pred[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar68[10] - (0xff < sVar11);
      comp_pred[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar68[0xc] - (0xff < sVar12);
      comp_pred[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar68[0xe] - (0xff < sVar13);
      comp_pred[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar37[0] - (0xff < sVar14);
      comp_pred[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar37[2] - (0xff < sVar15);
      comp_pred[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar37[4] - (0xff < sVar16);
      comp_pred[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar37[6] - (0xff < sVar17);
      comp_pred[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar37[8] - (0xff < sVar18);
      comp_pred[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar37[10] - (0xff < sVar19);
      comp_pred[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar37[0xc] - (0xff < sVar20);
      comp_pred[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar37[0xe] - (0xff < sVar21);
      auVar39 = *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride);
      auVar37 = lddqu(auVar37,*(undefined1 (*) [16])(*pauVar24 + iVar22));
      in_XMM4 = lddqu(auVar51,*(undefined1 (*) [16])(*(undefined1 (*) [16])ref + iVar26));
      auVar76._0_14_ = auVar37._0_14_;
      auVar76[0xe] = auVar37[7];
      auVar76[0xf] = in_XMM4[7];
      auVar75._14_2_ = auVar76._14_2_;
      auVar75._0_13_ = auVar37._0_13_;
      auVar75[0xd] = in_XMM4[6];
      auVar74._13_3_ = auVar75._13_3_;
      auVar74._0_12_ = auVar37._0_12_;
      auVar74[0xc] = auVar37[6];
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._0_11_ = auVar37._0_11_;
      auVar73[0xb] = in_XMM4[5];
      auVar72._11_5_ = auVar73._11_5_;
      auVar72._0_10_ = auVar37._0_10_;
      auVar72[10] = auVar37[5];
      auVar71._10_6_ = auVar72._10_6_;
      auVar71._0_9_ = auVar37._0_9_;
      auVar71[9] = in_XMM4[4];
      auVar70._9_7_ = auVar71._9_7_;
      auVar70._0_8_ = auVar37._0_8_;
      auVar70[8] = auVar37[4];
      auVar69._8_8_ = auVar70._8_8_;
      auVar69[7] = in_XMM4[3];
      auVar69[6] = auVar37[3];
      auVar69[5] = in_XMM4[2];
      auVar69[4] = auVar37[2];
      auVar69[3] = in_XMM4[1];
      auVar69[2] = auVar37[1];
      auVar69[0] = auVar37[0];
      auVar69[1] = in_XMM4[0];
      auVar123._0_14_ = auVar39._0_14_;
      auVar123[0xe] = auVar39[7];
      auVar123[0xf] = '@' - auVar39[7];
      auVar122._14_2_ = auVar123._14_2_;
      auVar122._0_13_ = auVar39._0_13_;
      auVar122[0xd] = '@' - auVar39[6];
      auVar121._13_3_ = auVar122._13_3_;
      auVar121._0_12_ = auVar39._0_12_;
      auVar121[0xc] = auVar39[6];
      auVar120._12_4_ = auVar121._12_4_;
      auVar120._0_11_ = auVar39._0_11_;
      auVar120[0xb] = '@' - auVar39[5];
      auVar119._11_5_ = auVar120._11_5_;
      auVar119._0_10_ = auVar39._0_10_;
      auVar119[10] = auVar39[5];
      auVar118._10_6_ = auVar119._10_6_;
      auVar118._0_9_ = auVar39._0_9_;
      auVar118[9] = '@' - auVar39[4];
      auVar117._9_7_ = auVar118._9_7_;
      auVar117._0_8_ = auVar39._0_8_;
      auVar117[8] = auVar39[4];
      auVar116._8_8_ = auVar117._8_8_;
      auVar116[7] = '@' - auVar39[3];
      auVar116[6] = auVar39[3];
      auVar116[5] = '@' - auVar39[2];
      auVar116[4] = auVar39[2];
      auVar116[3] = '@' - auVar39[1];
      auVar116[2] = auVar39[1];
      auVar116[1] = '@' - auVar39[0];
      auVar116[0] = auVar39[0];
      auVar51 = pmaddubsw(auVar69,auVar116);
      auVar40[1] = in_XMM4[8];
      auVar40[0] = auVar37[8];
      auVar40[2] = auVar37[9];
      auVar40[3] = in_XMM4[9];
      auVar40[4] = auVar37[10];
      auVar40[5] = in_XMM4[10];
      auVar40[6] = auVar37[0xb];
      auVar40[7] = in_XMM4[0xb];
      auVar40[8] = auVar37[0xc];
      auVar40[9] = in_XMM4[0xc];
      auVar40[10] = auVar37[0xd];
      auVar40[0xb] = in_XMM4[0xd];
      auVar40[0xc] = auVar37[0xe];
      auVar40[0xd] = in_XMM4[0xe];
      auVar40[0xe] = auVar37[0xf];
      auVar40[0xf] = in_XMM4[0xf];
      auVar30[1] = '@' - auVar39[8];
      auVar30[0] = auVar39[8];
      auVar30[2] = auVar39[9];
      auVar30[3] = '@' - auVar39[9];
      auVar30[4] = auVar39[10];
      auVar30[5] = '@' - auVar39[10];
      auVar30[6] = auVar39[0xb];
      auVar30[7] = '@' - auVar39[0xb];
      auVar30[8] = auVar39[0xc];
      auVar30[9] = '@' - auVar39[0xc];
      auVar30[10] = auVar39[0xd];
      auVar30[0xb] = '@' - auVar39[0xd];
      auVar30[0xc] = auVar39[0xe];
      auVar30[0xd] = '@' - auVar39[0xe];
      auVar30[0xe] = auVar39[0xf];
      auVar30[0xf] = '@' - auVar39[0xf];
      auVar39 = pmaddubsw(auVar40,auVar30);
      auVar37 = pmulhrsw(auVar51,auVar23);
      in_XMM3 = pmulhrsw(auVar39,auVar23);
      sVar6 = auVar37._0_2_;
      sVar7 = auVar37._2_2_;
      sVar8 = auVar37._4_2_;
      sVar9 = auVar37._6_2_;
      sVar10 = auVar37._8_2_;
      sVar11 = auVar37._10_2_;
      sVar12 = auVar37._12_2_;
      sVar13 = auVar37._14_2_;
      sVar14 = in_XMM3._0_2_;
      sVar15 = in_XMM3._2_2_;
      sVar16 = in_XMM3._4_2_;
      sVar17 = in_XMM3._6_2_;
      sVar18 = in_XMM3._8_2_;
      sVar19 = in_XMM3._10_2_;
      sVar20 = in_XMM3._12_2_;
      sVar21 = in_XMM3._14_2_;
      comp_pred[0x10] = (0 < sVar6) * (sVar6 < 0x100) * auVar37[0] - (0xff < sVar6);
      comp_pred[0x11] = (0 < sVar7) * (sVar7 < 0x100) * auVar37[2] - (0xff < sVar7);
      comp_pred[0x12] = (0 < sVar8) * (sVar8 < 0x100) * auVar37[4] - (0xff < sVar8);
      comp_pred[0x13] = (0 < sVar9) * (sVar9 < 0x100) * auVar37[6] - (0xff < sVar9);
      comp_pred[0x14] = (0 < sVar10) * (sVar10 < 0x100) * auVar37[8] - (0xff < sVar10);
      comp_pred[0x15] = (0 < sVar11) * (sVar11 < 0x100) * auVar37[10] - (0xff < sVar11);
      comp_pred[0x16] = (0 < sVar12) * (sVar12 < 0x100) * auVar37[0xc] - (0xff < sVar12);
      comp_pred[0x17] = (0 < sVar13) * (sVar13 < 0x100) * auVar37[0xe] - (0xff < sVar13);
      comp_pred[0x18] = (0 < sVar14) * (sVar14 < 0x100) * in_XMM3[0] - (0xff < sVar14);
      comp_pred[0x19] = (0 < sVar15) * (sVar15 < 0x100) * in_XMM3[2] - (0xff < sVar15);
      comp_pred[0x1a] = (0 < sVar16) * (sVar16 < 0x100) * in_XMM3[4] - (0xff < sVar16);
      comp_pred[0x1b] = (0 < sVar17) * (sVar17 < 0x100) * in_XMM3[6] - (0xff < sVar17);
      comp_pred[0x1c] = (0 < sVar18) * (sVar18 < 0x100) * in_XMM3[8] - (0xff < sVar18);
      comp_pred[0x1d] = (0 < sVar19) * (sVar19 < 0x100) * in_XMM3[10] - (0xff < sVar19);
      comp_pred[0x1e] = (0 < sVar20) * (sVar20 < 0x100) * in_XMM3[0xc] - (0xff < sVar20);
      comp_pred[0x1f] = (0 < sVar21) * (sVar21 < 0x100) * in_XMM3[0xe] - (0xff < sVar21);
      comp_pred = comp_pred + 0x20;
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + iVar22 * 2);
      ref = *(undefined1 (*) [16])ref + iVar26 * 2;
      mask = *(undefined1 (*) [16])mask + mask_stride * 2;
      iVar25 = iVar25 + 2;
    } while (iVar25 < height);
  }
  else {
    iVar25 = 1;
    if (1 < height) {
      iVar25 = height;
    }
    iVar27 = 0;
    do {
      if (0 < width) {
        lVar28 = 0;
        do {
          auVar39 = *(undefined1 (*) [16])(mask + lVar28);
          auVar37 = lddqu(in_XMM3,*(undefined1 (*) [16])(*pauVar24 + lVar28));
          auVar51 = lddqu(in_XMM4,*(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar28));
          auVar85._0_14_ = auVar37._0_14_;
          auVar85[0xe] = auVar37[7];
          auVar85[0xf] = auVar51[7];
          auVar84._14_2_ = auVar85._14_2_;
          auVar84._0_13_ = auVar37._0_13_;
          auVar84[0xd] = auVar51[6];
          auVar83._13_3_ = auVar84._13_3_;
          auVar83._0_12_ = auVar37._0_12_;
          auVar83[0xc] = auVar37[6];
          auVar82._12_4_ = auVar83._12_4_;
          auVar82._0_11_ = auVar37._0_11_;
          auVar82[0xb] = auVar51[5];
          auVar81._11_5_ = auVar82._11_5_;
          auVar81._0_10_ = auVar37._0_10_;
          auVar81[10] = auVar37[5];
          auVar80._10_6_ = auVar81._10_6_;
          auVar80._0_9_ = auVar37._0_9_;
          auVar80[9] = auVar51[4];
          auVar79._9_7_ = auVar80._9_7_;
          auVar79._0_8_ = auVar37._0_8_;
          auVar79[8] = auVar37[4];
          auVar78._8_8_ = auVar79._8_8_;
          auVar78[7] = auVar51[3];
          auVar78[6] = auVar37[3];
          auVar78[5] = auVar51[2];
          auVar78[4] = auVar37[2];
          auVar78[3] = auVar51[1];
          auVar78[2] = auVar37[1];
          auVar78[0] = auVar37[0];
          auVar78[1] = auVar51[0];
          auVar131._0_14_ = auVar39._0_14_;
          auVar131[0xe] = auVar39[7];
          auVar131[0xf] = '@' - auVar39[7];
          auVar130._14_2_ = auVar131._14_2_;
          auVar130._0_13_ = auVar39._0_13_;
          auVar130[0xd] = '@' - auVar39[6];
          auVar129._13_3_ = auVar130._13_3_;
          auVar129._0_12_ = auVar39._0_12_;
          auVar129[0xc] = auVar39[6];
          auVar128._12_4_ = auVar129._12_4_;
          auVar128._0_11_ = auVar39._0_11_;
          auVar128[0xb] = '@' - auVar39[5];
          auVar127._11_5_ = auVar128._11_5_;
          auVar127._0_10_ = auVar39._0_10_;
          auVar127[10] = auVar39[5];
          auVar126._10_6_ = auVar127._10_6_;
          auVar126._0_9_ = auVar39._0_9_;
          auVar126[9] = '@' - auVar39[4];
          auVar125._9_7_ = auVar126._9_7_;
          auVar125._0_8_ = auVar39._0_8_;
          auVar125[8] = auVar39[4];
          auVar124._8_8_ = auVar125._8_8_;
          auVar124[7] = '@' - auVar39[3];
          auVar124[6] = auVar39[3];
          auVar124[5] = '@' - auVar39[2];
          auVar124[4] = auVar39[2];
          auVar124[3] = '@' - auVar39[1];
          auVar124[2] = auVar39[1];
          auVar124[1] = '@' - auVar39[0];
          auVar124[0] = auVar39[0];
          auVar68 = pmaddubsw(auVar78,auVar124);
          auVar49[1] = auVar51[8];
          auVar49[0] = auVar37[8];
          auVar49[2] = auVar37[9];
          auVar49[3] = auVar51[9];
          auVar49[4] = auVar37[10];
          auVar49[5] = auVar51[10];
          auVar49[6] = auVar37[0xb];
          auVar49[7] = auVar51[0xb];
          auVar49[8] = auVar37[0xc];
          auVar49[9] = auVar51[0xc];
          auVar49[10] = auVar37[0xd];
          auVar49[0xb] = auVar51[0xd];
          auVar49[0xc] = auVar37[0xe];
          auVar49[0xd] = auVar51[0xe];
          auVar49[0xe] = auVar37[0xf];
          auVar49[0xf] = auVar51[0xf];
          auVar35[1] = '@' - auVar39[8];
          auVar35[0] = auVar39[8];
          auVar35[2] = auVar39[9];
          auVar35[3] = '@' - auVar39[9];
          auVar35[4] = auVar39[10];
          auVar35[5] = '@' - auVar39[10];
          auVar35[6] = auVar39[0xb];
          auVar35[7] = '@' - auVar39[0xb];
          auVar35[8] = auVar39[0xc];
          auVar35[9] = '@' - auVar39[0xc];
          auVar35[10] = auVar39[0xd];
          auVar35[0xb] = '@' - auVar39[0xd];
          auVar35[0xc] = auVar39[0xe];
          auVar35[0xd] = '@' - auVar39[0xe];
          auVar35[0xe] = auVar39[0xf];
          auVar35[0xf] = '@' - auVar39[0xf];
          auVar39 = pmaddubsw(auVar49,auVar35);
          auVar68 = pmulhrsw(auVar68,auVar23);
          auVar37 = pmulhrsw(auVar39,auVar23);
          sVar6 = auVar68._0_2_;
          sVar7 = auVar68._2_2_;
          sVar8 = auVar68._4_2_;
          sVar9 = auVar68._6_2_;
          sVar10 = auVar68._8_2_;
          sVar11 = auVar68._10_2_;
          sVar12 = auVar68._12_2_;
          sVar13 = auVar68._14_2_;
          sVar14 = auVar37._0_2_;
          sVar15 = auVar37._2_2_;
          sVar16 = auVar37._4_2_;
          sVar17 = auVar37._6_2_;
          sVar18 = auVar37._8_2_;
          sVar19 = auVar37._10_2_;
          sVar20 = auVar37._12_2_;
          sVar21 = auVar37._14_2_;
          puVar1 = comp_pred + lVar28;
          *puVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar68[0] - (0xff < sVar6);
          puVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar68[2] - (0xff < sVar7);
          puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar68[4] - (0xff < sVar8);
          puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar68[6] - (0xff < sVar9);
          puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar68[8] - (0xff < sVar10);
          puVar1[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar68[10] - (0xff < sVar11);
          puVar1[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar68[0xc] - (0xff < sVar12);
          puVar1[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar68[0xe] - (0xff < sVar13);
          puVar1[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar37[0] - (0xff < sVar14);
          puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar37[2] - (0xff < sVar15);
          puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar37[4] - (0xff < sVar16);
          puVar1[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar37[6] - (0xff < sVar17);
          puVar1[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar37[8] - (0xff < sVar18);
          puVar1[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar37[10] - (0xff < sVar19);
          puVar1[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar37[0xc] - (0xff < sVar20);
          puVar1[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar37[0xe] - (0xff < sVar21);
          auVar39 = *(undefined1 (*) [16])(mask + lVar28 + 0x10);
          auVar37 = lddqu(auVar37,*(undefined1 (*) [16])(pauVar24[1] + lVar28));
          in_XMM4 = lddqu(auVar51,*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)ref + 0x10) + lVar28));
          auVar93._0_14_ = auVar37._0_14_;
          auVar93[0xe] = auVar37[7];
          auVar93[0xf] = in_XMM4[7];
          auVar92._14_2_ = auVar93._14_2_;
          auVar92._0_13_ = auVar37._0_13_;
          auVar92[0xd] = in_XMM4[6];
          auVar91._13_3_ = auVar92._13_3_;
          auVar91._0_12_ = auVar37._0_12_;
          auVar91[0xc] = auVar37[6];
          auVar90._12_4_ = auVar91._12_4_;
          auVar90._0_11_ = auVar37._0_11_;
          auVar90[0xb] = in_XMM4[5];
          auVar89._11_5_ = auVar90._11_5_;
          auVar89._0_10_ = auVar37._0_10_;
          auVar89[10] = auVar37[5];
          auVar88._10_6_ = auVar89._10_6_;
          auVar88._0_9_ = auVar37._0_9_;
          auVar88[9] = in_XMM4[4];
          auVar87._9_7_ = auVar88._9_7_;
          auVar87._0_8_ = auVar37._0_8_;
          auVar87[8] = auVar37[4];
          auVar86._8_8_ = auVar87._8_8_;
          auVar86[7] = in_XMM4[3];
          auVar86[6] = auVar37[3];
          auVar86[5] = in_XMM4[2];
          auVar86[4] = auVar37[2];
          auVar86[3] = in_XMM4[1];
          auVar86[2] = auVar37[1];
          auVar86[0] = auVar37[0];
          auVar86[1] = in_XMM4[0];
          auVar139._0_14_ = auVar39._0_14_;
          auVar139[0xe] = auVar39[7];
          auVar139[0xf] = '@' - auVar39[7];
          auVar138._14_2_ = auVar139._14_2_;
          auVar138._0_13_ = auVar39._0_13_;
          auVar138[0xd] = '@' - auVar39[6];
          auVar137._13_3_ = auVar138._13_3_;
          auVar137._0_12_ = auVar39._0_12_;
          auVar137[0xc] = auVar39[6];
          auVar136._12_4_ = auVar137._12_4_;
          auVar136._0_11_ = auVar39._0_11_;
          auVar136[0xb] = '@' - auVar39[5];
          auVar135._11_5_ = auVar136._11_5_;
          auVar135._0_10_ = auVar39._0_10_;
          auVar135[10] = auVar39[5];
          auVar134._10_6_ = auVar135._10_6_;
          auVar134._0_9_ = auVar39._0_9_;
          auVar134[9] = '@' - auVar39[4];
          auVar133._9_7_ = auVar134._9_7_;
          auVar133._0_8_ = auVar39._0_8_;
          auVar133[8] = auVar39[4];
          auVar132._8_8_ = auVar133._8_8_;
          auVar132[7] = '@' - auVar39[3];
          auVar132[6] = auVar39[3];
          auVar132[5] = '@' - auVar39[2];
          auVar132[4] = auVar39[2];
          auVar132[3] = '@' - auVar39[1];
          auVar132[2] = auVar39[1];
          auVar132[1] = '@' - auVar39[0];
          auVar132[0] = auVar39[0];
          auVar51 = pmaddubsw(auVar86,auVar132);
          auVar50[1] = in_XMM4[8];
          auVar50[0] = auVar37[8];
          auVar50[2] = auVar37[9];
          auVar50[3] = in_XMM4[9];
          auVar50[4] = auVar37[10];
          auVar50[5] = in_XMM4[10];
          auVar50[6] = auVar37[0xb];
          auVar50[7] = in_XMM4[0xb];
          auVar50[8] = auVar37[0xc];
          auVar50[9] = in_XMM4[0xc];
          auVar50[10] = auVar37[0xd];
          auVar50[0xb] = in_XMM4[0xd];
          auVar50[0xc] = auVar37[0xe];
          auVar50[0xd] = in_XMM4[0xe];
          auVar50[0xe] = auVar37[0xf];
          auVar50[0xf] = in_XMM4[0xf];
          auVar36[1] = '@' - auVar39[8];
          auVar36[0] = auVar39[8];
          auVar36[2] = auVar39[9];
          auVar36[3] = '@' - auVar39[9];
          auVar36[4] = auVar39[10];
          auVar36[5] = '@' - auVar39[10];
          auVar36[6] = auVar39[0xb];
          auVar36[7] = '@' - auVar39[0xb];
          auVar36[8] = auVar39[0xc];
          auVar36[9] = '@' - auVar39[0xc];
          auVar36[10] = auVar39[0xd];
          auVar36[0xb] = '@' - auVar39[0xd];
          auVar36[0xc] = auVar39[0xe];
          auVar36[0xd] = '@' - auVar39[0xe];
          auVar36[0xe] = auVar39[0xf];
          auVar36[0xf] = '@' - auVar39[0xf];
          auVar39 = pmaddubsw(auVar50,auVar36);
          auVar37 = pmulhrsw(auVar51,auVar23);
          in_XMM3 = pmulhrsw(auVar39,auVar23);
          sVar6 = auVar37._0_2_;
          sVar7 = auVar37._2_2_;
          sVar8 = auVar37._4_2_;
          sVar9 = auVar37._6_2_;
          sVar10 = auVar37._8_2_;
          sVar11 = auVar37._10_2_;
          sVar12 = auVar37._12_2_;
          sVar13 = auVar37._14_2_;
          sVar14 = in_XMM3._0_2_;
          sVar15 = in_XMM3._2_2_;
          sVar16 = in_XMM3._4_2_;
          sVar17 = in_XMM3._6_2_;
          sVar18 = in_XMM3._8_2_;
          sVar19 = in_XMM3._10_2_;
          sVar20 = in_XMM3._12_2_;
          sVar21 = in_XMM3._14_2_;
          puVar1 = comp_pred + lVar28 + 0x10;
          *puVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar37[0] - (0xff < sVar6);
          puVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar37[2] - (0xff < sVar7);
          puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar37[4] - (0xff < sVar8);
          puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar37[6] - (0xff < sVar9);
          puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar37[8] - (0xff < sVar10);
          puVar1[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar37[10] - (0xff < sVar11);
          puVar1[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar37[0xc] - (0xff < sVar12);
          puVar1[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar37[0xe] - (0xff < sVar13);
          puVar1[8] = (0 < sVar14) * (sVar14 < 0x100) * in_XMM3[0] - (0xff < sVar14);
          puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * in_XMM3[2] - (0xff < sVar15);
          puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * in_XMM3[4] - (0xff < sVar16);
          puVar1[0xb] = (0 < sVar17) * (sVar17 < 0x100) * in_XMM3[6] - (0xff < sVar17);
          puVar1[0xc] = (0 < sVar18) * (sVar18 < 0x100) * in_XMM3[8] - (0xff < sVar18);
          puVar1[0xd] = (0 < sVar19) * (sVar19 < 0x100) * in_XMM3[10] - (0xff < sVar19);
          puVar1[0xe] = (0 < sVar20) * (sVar20 < 0x100) * in_XMM3[0xc] - (0xff < sVar20);
          puVar1[0xf] = (0 < sVar21) * (sVar21 < 0x100) * in_XMM3[0xe] - (0xff < sVar21);
          lVar28 = lVar28 + 0x20;
        } while (lVar28 < width);
        comp_pred = comp_pred + lVar28;
      }
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + iVar22);
      ref = *(undefined1 (*) [16])ref + iVar26;
      mask = mask + mask_stride;
      iVar27 = iVar27 + 1;
    } while (iVar27 != iVar25);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_ssse3(uint8_t *comp_pred, const uint8_t *pred,
                              int width, int height, const uint8_t *ref,
                              int ref_stride, const uint8_t *mask,
                              int mask_stride, int invert_mask) {
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  assert(height % 2 == 0);
  int i = 0;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      comp_mask_pred_16_ssse3(src0, src1, mask, comp_pred);
      comp_mask_pred_16_ssse3(src0 + stride0, src1 + stride1,
                              mask + mask_stride, comp_pred + width);
      comp_pred += (width << 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      i += 2;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        comp_mask_pred_16_ssse3(src0 + x, src1 + x, mask + x, comp_pred);
        comp_mask_pred_16_ssse3(src0 + x + 16, src1 + x + 16, mask + x + 16,
                                comp_pred + 16);
        comp_pred += 32;
      }
      src0 += (stride0);
      src1 += (stride1);
      mask += (mask_stride);
      i += 1;
    } while (i < height);
  }
}